

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

bool __thiscall flexbuffers::Verifier::VerifyKey(Verifier *this,uint8_t *p)

{
  uchar uVar1;
  uint8_t uVar2;
  pointer puVar3;
  bool bVar4;
  long lVar5;
  byte bVar6;
  
  if (this->reuse_tracker_ != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    lVar5 = (long)p - (long)this->buf_;
    puVar3 = (this->reuse_tracker_->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = puVar3[lVar5];
    if (uVar1 == '\x10') {
      bVar4 = false;
      lVar5 = 1;
    }
    else if (uVar1 == '\0') {
      puVar3[lVar5] = '\x10';
      bVar4 = true;
    }
    else {
      lVar5 = 0;
      bVar4 = false;
    }
    bVar6 = (byte)lVar5;
    if (!bVar4) goto LAB_0030629f;
  }
  do {
    bVar6 = p < this->buf_ + this->size_;
    if (!(bool)bVar6) break;
    uVar2 = *p;
    p = p + 1;
  } while (uVar2 == '\0');
LAB_0030629f:
  return (bool)(bVar6 & 1);
}

Assistant:

bool VerifyKey(const uint8_t *p) {
    FLEX_CHECK_VERIFIED(p, PackedType(BIT_WIDTH_8, FBT_KEY));
    while (p < buf_ + size_)
      if (*p++) return true;
    return false;
  }